

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

string * joinCommandLine(string *__return_storage_ptr__,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args)

{
  pointer pbVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  size_type *psVar6;
  size_type sVar7;
  _Alloc_hider _Var8;
  pointer __rhs;
  __string_type __str;
  size_type *local_78;
  ulong local_70;
  size_type local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    do {
      lVar3 = std::__cxx11::string::find((char)__rhs,0x20);
      if (lVar3 == -1) {
        pcVar2 = (__rhs->_M_dataplus)._M_p;
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + __rhs->_M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        uVar5 = local_68;
        _Var8._M_p = (pointer)local_78;
        if (local_78 != &local_68) goto LAB_00179b9e;
      }
      else {
        std::operator+(&local_50,"\"",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          local_68 = *psVar6;
          lStack_60 = plVar4[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *psVar6;
          local_78 = (size_type *)*plVar4;
        }
        local_70 = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        uVar5 = local_50.field_2._M_allocated_capacity;
        _Var8._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00179b9e:
          operator_delete(_Var8._M_p,uVar5 + 1);
        }
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar1);
  }
  sVar7 = __return_storage_ptr__->_M_string_length - 1;
  if (__return_storage_ptr__->_M_string_length == 0) {
    uVar5 = std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase");
    plVar4 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4 != local_58) {
      operator_delete(plVar4,local_58->_M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar5);
  }
  __return_storage_ptr__->_M_string_length = sVar7;
  (__return_storage_ptr__->_M_dataplus)._M_p[sVar7] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string joinCommandLine(const std::vector<std::string>& args)
{
  std::string ret;

  for (std::string const& s : args) {
    if (s.find(' ') == std::string::npos) {
      ret += s + ' ';
    } else {
      ret += "\"" + s + "\" ";
    }
  }

  // drop trailing whitespace
  ret.erase(ret.size() - 1);

  return ret;
}